

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Template.hpp
# Opt level: O3

bool __thiscall
Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::isEqual
          (TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_> *this,
          QExpression *left,QExpression *right)

{
  bool bVar1;
  QNumberType QVar2;
  Value<char> *this_00;
  Value<char> *pVVar3;
  Value<char> *pVVar4;
  ulong uVar5;
  char *pcVar6;
  SizeT SVar7;
  Value<char> *pVVar8;
  SizeT SVar9;
  char *pcVar10;
  
  bVar1 = true;
  if (left->Type - 1 < 3) {
    pcVar10 = (char *)0x0;
    SVar7 = 0;
    this_00 = (Value<char> *)0x0;
  }
  else {
    if (left->Type == Variable) {
      this_00 = getValue(this,(VariableTag *)left);
      pVVar3 = this_00;
      if (this_00 == (Value<char> *)0x0) {
        return false;
      }
      for (; pVVar3->type_ == 1; pVVar3 = (pVVar3->field_0).array_.storage_) {
      }
      pVVar4 = this_00;
      if (pVVar3->type_ - 5 < 3) {
        QVar2 = Value<char>::SetNumber(this_00,(QNumber64 *)left);
        if (QVar2 == Real) {
          left->Type = RealNumber;
        }
        else if (QVar2 == Integer) {
          left->Type = IntegerNumber;
        }
        else if (QVar2 == Natural) {
          left->Type = NaturalNumber;
        }
        pcVar10 = (char *)0x0;
        SVar7 = 0;
        goto LAB_00116189;
      }
      for (; pVVar4->type_ == ValuePtr; pVVar4 = (pVVar4->field_0).array_.storage_) {
      }
      switch(pVVar4->type_) {
      case String:
        pcVar10 = (pVVar4->field_0).string_.storage_;
        SVar7 = (pVVar4->field_0).array_.index_;
        break;
      default:
        goto LAB_00116214;
      case True:
        SVar7 = 4;
        pcVar10 = "true";
        break;
      case False:
        SVar7 = 5;
        pcVar10 = "false";
        break;
      case Null:
        SVar7 = 4;
        pcVar10 = "null";
      }
    }
    else {
      SVar7 = (left->field_0).SubExpressions.capacity_;
      this_00 = (Value<char> *)0x0;
      pcVar10 = this->content_ + (left->field_0).SubExpressions.index_;
    }
    bVar1 = false;
  }
LAB_00116189:
  if (right->Type - 1 < 3) {
LAB_00116196:
    if (!bVar1) {
      if (this_00 == (Value<char> *)0x0) {
LAB_00116214:
        return false;
      }
      QVar2 = Value<char>::SetNumber(this_00,(QNumber64 *)left);
      if (QVar2 == Real) {
        left->Type = RealNumber;
      }
      else if (QVar2 == Integer) {
        left->Type = IntegerNumber;
      }
      else {
        if (QVar2 != Natural) {
          return false;
        }
        left->Type = NaturalNumber;
      }
    }
  }
  else {
    if (right->Type != Variable) {
      if (bVar1) {
        return false;
      }
      SVar9 = (right->field_0).SubExpressions.capacity_;
      pcVar6 = this->content_ + (right->field_0).SubExpressions.index_;
LAB_00116258:
      uVar5 = 0;
      if (SVar7 == SVar9) {
        if ((ulong)SVar7 != 0) {
          uVar5 = 0;
          do {
            if (pcVar10[uVar5] != pcVar6[uVar5]) goto LAB_00116280;
            uVar5 = uVar5 + 1;
          } while (SVar7 != uVar5);
          uVar5 = (ulong)SVar7;
        }
LAB_00116280:
        uVar5 = (ulong)((uint)uVar5 == SVar7);
      }
      goto LAB_001161a6;
    }
    pVVar4 = getValue(this,(VariableTag *)right);
    pVVar3 = pVVar4;
    if (pVVar4 == (Value<char> *)0x0) {
      return false;
    }
    for (; pVVar3->type_ == 1; pVVar3 = (pVVar3->field_0).array_.storage_) {
    }
    pVVar8 = pVVar4;
    if (pVVar3->type_ - 5 < 3) {
      QVar2 = Value<char>::SetNumber(pVVar4,(QNumber64 *)right);
      if ((byte)(QVar2 - Real) < 3) {
        right->Type = QVar2;
      }
      goto LAB_00116196;
    }
    for (; pVVar8->type_ == ValuePtr; pVVar8 = (pVVar8->field_0).array_.storage_) {
    }
    switch(pVVar8->type_) {
    case String:
      pcVar6 = (pVVar8->field_0).string_.storage_;
      SVar9 = (pVVar8->field_0).array_.index_;
      break;
    default:
      goto LAB_00116214;
    case True:
      SVar9 = 4;
      pcVar6 = "true";
      break;
    case False:
      SVar9 = 5;
      pcVar6 = "false";
      break;
    case Null:
      SVar9 = 4;
      pcVar6 = "null";
    }
    if (!bVar1) goto LAB_00116258;
    QVar2 = Value<char>::SetNumber(pVVar4,(QNumber64 *)right);
    if (QVar2 == Real) {
      right->Type = RealNumber;
    }
    else if (QVar2 == Integer) {
      right->Type = IntegerNumber;
    }
    else {
      if (QVar2 != Natural) {
        return false;
      }
      right->Type = NaturalNumber;
    }
  }
  bVar1 = QExpression::operator==(left,right);
  uVar5 = (ulong)bVar1;
LAB_001161a6:
  *(ulong *)&left->field_0 = uVar5;
  left->Type = NaturalNumber;
  return true;
}

Assistant:

bool isEqual(QExpression &left, QExpression &right) const noexcept {
        const Value_T *left_value        = nullptr;
        const Value_T *right_value       = nullptr;
        const Char_T  *left_content      = nullptr;
        const Char_T  *right_content     = nullptr;
        SizeT          left_length       = 0;
        SizeT          right_length      = 0;
        bool           left_is_a_number  = false;
        bool           right_is_a_number = false;

        switch (left.Type) {
            case ExpressionType::RealNumber:
            case ExpressionType::NaturalNumber:
            case ExpressionType::IntegerNumber: {
                left_is_a_number = true;
                break;
            }

            case ExpressionType::Variable: {
                left_value = getValue(left.Variable);

                if (left_value != nullptr) {
                    if (left_value->GetNumberType() != QNumberType::NotANumber) {
                        left_is_a_number = true;

                        switch (left_value->SetNumber(left.Value.Number)) {
                            case QNumberType::Natural: {
                                left.Type = ExpressionType::NaturalNumber;
                                break;
                            }

                            case QNumberType::Integer: {
                                left.Type = ExpressionType::IntegerNumber;
                                break;
                            }

                            case QNumberType::Real: {
                                left.Type = ExpressionType::RealNumber;
                                break;
                            }

                            default: {
                            }
                        }
                    } else if (!(left_value->SetCharAndLength(left_content, left_length))) {
                        return false;
                    }

                    break;
                }

                return false;
            }

            default: {
                left_content = (content_ + left.Value.Offset);
                left_length  = left.Value.Length;
            }
        }

        switch (right.Type) {
            case ExpressionType::RealNumber:
            case ExpressionType::NaturalNumber:
            case ExpressionType::IntegerNumber: {
                right_is_a_number = true;
                break;
            }

            case ExpressionType::Variable: {
                right_value = getValue(right.Variable);

                if (right_value != nullptr) {
                    if (right_value->GetNumberType() != QNumberType::NotANumber) {
                        right_is_a_number = true;

                        switch (right_value->SetNumber(right.Value.Number)) {
                            case QNumberType::Natural: {
                                right.Type = ExpressionType::NaturalNumber;
                                break;
                            }

                            case QNumberType::Integer: {
                                right.Type = ExpressionType::IntegerNumber;
                                break;
                            }

                            case QNumberType::Real: {
                                right.Type = ExpressionType::RealNumber;
                                break;
                            }

                            default: {
                            }
                        }
                    } else if (!(right_value->SetCharAndLength(right_content, right_length))) {
                        return false;
                    }

                    break;
                }

                return false;
            }

            default: {
                right_content     = (content_ + right.Value.Offset);
                right_length      = right.Value.Length;
                right_is_a_number = false;
            }
        }

        if (left_is_a_number || right_is_a_number) {
            if (!left_is_a_number) {
                if (left_value != nullptr) {
                    switch (left_value->SetNumber(left.Value.Number)) {
                        case QNumberType::Natural: {
                            left.Type = ExpressionType::NaturalNumber;
                            break;
                        }

                        case QNumberType::Integer: {
                            left.Type = ExpressionType::IntegerNumber;
                            break;
                        }

                        case QNumberType::Real: {
                            left.Type = ExpressionType::RealNumber;
                            break;
                        }

                        default: {
                            return false;
                        }
                    }
                } else {
                    return false;
                }
            }

            if (!right_is_a_number) {
                if (right_value != nullptr) {
                    switch (right_value->SetNumber(right.Value.Number)) {
                        case QNumberType::Natural: {
                            right.Type = ExpressionType::NaturalNumber;
                            break;
                        }

                        case QNumberType::Integer: {
                            right.Type = ExpressionType::IntegerNumber;
                            break;
                        }

                        case QNumberType::Real: {
                            right.Type = ExpressionType::RealNumber;
                            break;
                        }

                        default: {
                            return false;
                        }
                    }
                } else {
                    return false;
                }
            }

            left.Value.Number.Natural = SizeT64(left == right);
            left.Type                 = ExpressionType::NaturalNumber;
            return true;
        }

        left.Value.Number.Natural =
            ((left_length == right_length) && StringUtils::IsEqual(left_content, right_content, right_length));
        left.Type = ExpressionType::NaturalNumber;

        return true;
    }